

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleDisplay::relations
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *__return_storage_ptr__,QAccessibleDisplay *this,Relation match)

{
  QLabel *this_00;
  QWidget *pQVar1;
  long in_FS_OFFSET;
  QAccessibleInterface *iface;
  QAccessibleInterface *local_30;
  QFlagsStorage<QAccessible::RelationFlag> local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)&DAT_aaaaaaaaaaaaaaaa;
  QAccessibleWidget::relations(__return_storage_ptr__,&this->super_QAccessibleWidget,match);
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 2) != 0) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    this_00 = (QLabel *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
    if (this_00 != (QLabel *)0x0) {
      local_24.i = 2;
      pQVar1 = QLabel::buddy(this_00);
      local_30 = (QAccessibleInterface *)
                 QAccessible::queryAccessibleInterface(&pQVar1->super_QObject);
      if (local_30 != (QAccessibleInterface *)0x0) {
        QtPrivate::QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
        ::emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                  ((QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>
                    *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_30,
                   (QFlags<QAccessible::RelationFlag> *)&local_24);
        QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::end
                  (__return_storage_ptr__);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleDisplay::relations(QAccessible::Relation match /* = QAccessible::AllRelations */) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels =
            QAccessibleWidget::relations(match);
#    if QT_CONFIG(shortcut) && QT_CONFIG(label)
    if (match & QAccessible::Labelled) {
        if (QLabel *label = qobject_cast<QLabel*>(object())) {
            const QAccessible::Relation rel = QAccessible::Labelled;
            if (QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(label->buddy()))
                rels.emplace_back(iface, rel);
        }
    }
#endif
    return rels;
}